

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

uint __thiscall base_uint<256U>::bits(base_uint<256U> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int nbits;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar1 = 7;
  uVar3 = 0x100;
  do {
    if (this->pn[uVar1] != 0) {
      uVar4 = 0x1f;
      uVar5 = 0x20;
      uVar2 = uVar3;
      goto LAB_00154754;
    }
    uVar1 = uVar1 - 1;
    uVar3 = uVar3 - 0x20;
  } while (uVar3 != 0);
  uVar2 = 0;
  goto LAB_00154769;
  while( true ) {
    uVar4 = uVar4 - 1;
    uVar2 = uVar2 - 1;
    uVar5 = uVar5 - 1;
    if (uVar5 < 2) break;
LAB_00154754:
    if ((this->pn[uVar1] >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00154769;
  }
  uVar2 = uVar3 - 0x1f;
LAB_00154769:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int base_uint<BITS>::bits() const
{
    for (int pos = WIDTH - 1; pos >= 0; pos--) {
        if (pn[pos]) {
            for (int nbits = 31; nbits > 0; nbits--) {
                if (pn[pos] & 1U << nbits)
                    return 32 * pos + nbits + 1;
            }
            return 32 * pos + 1;
        }
    }
    return 0;
}